

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void aom_highbd_filter_block1d16_h4_avx2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  int in_R9D;
  int16_t *in_stack_000002a8;
  uint32_t in_stack_000002b4;
  ptrdiff_t in_stack_000002b8;
  uint16_t *in_stack_000002c0;
  ptrdiff_t in_stack_000002c8;
  uint16_t *in_stack_000002d0;
  
  aom_highbd_filter_block1d8_h4_avx2
            (in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,
             in_stack_000002b4,in_stack_000002a8,in_R9D);
  aom_highbd_filter_block1d8_h4_avx2
            (in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,
             in_stack_000002b4,in_stack_000002a8,in_R9D);
  return;
}

Assistant:

static void aom_highbd_filter_block1d16_h4_avx2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  aom_highbd_filter_block1d8_h4_avx2(src_ptr, src_pitch, dst_ptr, dst_pitch,
                                     height, filter, bd);
  aom_highbd_filter_block1d8_h4_avx2(src_ptr + 8, src_pitch, dst_ptr + 8,
                                     dst_pitch, height, filter, bd);
}